

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLNode_add_child(XMLNode *node,XMLNode *child)

{
  int iVar1;
  XMLNode *child_local;
  XMLNode *node_local;
  
  if ((((node == (XMLNode *)0x0) || (child == (XMLNode *)0x0)) || (node->init_value != 0x19770522))
     || (child->init_value != 0x19770522)) {
    node_local._4_4_ = 0;
  }
  else {
    iVar1 = _add_node(&node->children,&node->n_children,child);
    if (iVar1 < 0) {
      node_local._4_4_ = 0;
    }
    else {
      node->tag_type = TAG_FATHER;
      child->father = node;
      node_local._4_4_ = 1;
    }
  }
  return node_local._4_4_;
}

Assistant:

int XMLNode_add_child(XMLNode* node, XMLNode* child)
{
	if (node == NULL || child == NULL || node->init_value != XML_INIT_DONE || child->init_value != XML_INIT_DONE)
		return FALSE;
	
	if (_add_node(&node->children, &node->n_children, child) >= 0) {
		node->tag_type = TAG_FATHER;
		child->father = node;
		return TRUE;
	} else
		return FALSE;
}